

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O0

int AF_AActor_A_ResetHealth
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  player_t *ppVar1;
  int iVar2;
  VMValue *pVVar3;
  AActor *pAVar4;
  bool bVar5;
  bool local_5b;
  player_t *player;
  AActor *mobj;
  int ptr;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1921,
                  "int AF_AActor_A_ResetHealth(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
    ;
  }
  bVar5 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar5 = true, (param->field_0).field_1.atag != 1)) {
    bVar5 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (bVar5) {
    pAVar4 = (AActor *)(param->field_0).field_1.a;
    local_5b = true;
    if (pAVar4 != (AActor *)0x0) {
      local_5b = DObject::IsKindOf((DObject *)pAVar4,AActor::RegistrationInfo.MyClass);
    }
    if (local_5b != false) {
      if (numparam < 2) {
        pVVar3 = TArray<VMValue,_VMValue>::operator[](defaultparam,1);
        if ((pVVar3->field_0).field_3.Type != '\0') {
          __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x1922,
                        "int AF_AActor_A_ResetHealth(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pVVar3 = TArray<VMValue,_VMValue>::operator[](defaultparam,1);
        mobj._4_4_ = (pVVar3->field_0).i;
      }
      else {
        if (param[1].field_0.field_3.Type != '\0') {
          __assert_fail("(param[paramnum]).Type == REGT_INT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x1922,
                        "int AF_AActor_A_ResetHealth(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        mobj._4_4_ = param[1].field_0.i;
      }
      pAVar4 = COPY_AAPTR(pAVar4,mobj._4_4_);
      if (pAVar4 != (AActor *)0x0) {
        ppVar1 = pAVar4->player;
        if ((ppVar1 == (player_t *)0x0) || ((ppVar1->mo->super_AActor).health < 1)) {
          if ((pAVar4 != (AActor *)0x0) && (0 < pAVar4->health)) {
            iVar2 = AActor::SpawnHealth(pAVar4);
            pAVar4->health = iVar2;
          }
        }
        else {
          pAVar4 = AActor::GetDefault(&ppVar1->mo->super_AActor);
          iVar2 = pAVar4->health;
          (ppVar1->mo->super_AActor).health = iVar2;
          ppVar1->health = iVar2;
        }
      }
      return 0;
    }
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1921,
                  "int AF_AActor_A_ResetHealth(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
    ;
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x1921,
                "int AF_AActor_A_ResetHealth(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_ResetHealth)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT_DEF(ptr);

	AActor *mobj = COPY_AAPTR(self, ptr);

	if (!mobj)
	{
		return 0;
	}

	player_t *player = mobj->player;
	if (player && (player->mo->health > 0))
	{
		player->health = player->mo->health = player->mo->GetDefault()->health; //Copied from the resurrect cheat.
	}
	else if (mobj && (mobj->health > 0))
	{
		mobj->health = mobj->SpawnHealth();
	}
	return 0;
}